

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void ResetLineAfterWrap(TidyPrintImpl *pprint)

{
  Bool BVar1;
  uint *puVar2;
  bool bVar3;
  uint *end;
  uint *q;
  uint *p;
  TidyPrintImpl *pprint_local;
  
  if (pprint->wraphere < pprint->linelen) {
    q = pprint->linebuf;
    end = q + pprint->wraphere;
    puVar2 = q + pprint->linelen;
    BVar1 = IsWrapInAttrVal(pprint);
    if (BVar1 == no) {
      while( true ) {
        bVar3 = false;
        if (end < puVar2) {
          bVar3 = *end == 0x20;
        }
        if (!bVar3) break;
        end = end + 1;
        pprint->wraphere = pprint->wraphere + 1;
      }
    }
    while (end < puVar2) {
      *q = *end;
      end = end + 1;
      q = q + 1;
    }
    pprint->linelen = pprint->linelen - pprint->wraphere;
  }
  else {
    pprint->linelen = 0;
  }
  ResetLine(pprint);
  return;
}

Assistant:

static void ResetLineAfterWrap( TidyPrintImpl* pprint )
{
    if ( pprint->linelen > pprint->wraphere )
    {
        uint *p = pprint->linebuf;
        uint *q = p + pprint->wraphere;
        uint *end = p + pprint->linelen;

        if ( ! IsWrapInAttrVal(pprint) )
        {
            while ( q < end && *q == ' ' )
                ++q, ++pprint->wraphere;
        }

        while ( q < end )
            *p++ = *q++;

        pprint->linelen -= pprint->wraphere;
    }
    else
    {
        pprint->linelen = 0;
    }

    ResetLine( pprint );
}